

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAESDecodeStream.cpp
# Opt level: O3

void __thiscall
InputAESDecodeStream::Assign(InputAESDecodeStream *this,IByteReader *inSourceReader,ByteList *inKey)

{
  uchar *key;
  long lVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  
  this->mSourceStream = inSourceReader;
  uVar3 = (inKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl._M_node.
          _M_size;
  this->mKeyLength = uVar3;
  key = (uchar *)operator_new__(uVar3);
  this->mKey = key;
  p_Var2 = (inKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)inKey) {
    lVar1 = 0;
    do {
      this->mKey[lVar1] = *(uchar *)&p_Var2[1]._M_next;
      lVar1 = lVar1 + 1;
      p_Var2 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var2->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)inKey);
    key = this->mKey;
    uVar3 = this->mKeyLength;
  }
  aes_decrypt_key(key,(int)uVar3,(this->mDecrypt).cx);
  this->mReadBlockSize = '\x10';
  this->mIsIvInit = false;
  this->mOutIndex = (uchar *)&this->mOutIndex;
  this->mHitEnd = false;
  return;
}

Assistant:

void InputAESDecodeStream::Assign(IByteReader* inSourceReader, const ByteList& inKey)
{
	mSourceStream = inSourceReader;

	// convert inEncryptionKey to internal rep and init decrypt [let's hope its 16...]
	mKeyLength = inKey.size();
	mKey = new unsigned char[mKeyLength];
	ByteList::const_iterator it = inKey.begin();
	size_t i = 0;
	for (; it != inKey.end(); ++i, ++it)
		mKey[i] = *it;
	mDecrypt.key(mKey, mKeyLength);
	mIsIvInit = false; // first read flag. still need to read IV
	mReadBlockSize = AES_BLOCK_SIZE;
	mOutIndex = mOut + mReadBlockSize;
	mHitEnd = false;
}